

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

bool __thiscall
ThreadContext::IsIsInstInlineCacheRegistered
          (ThreadContext *this,IsInstInlineCache *inlineCache,Var function)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ThreadContext *this_00;
  Var local_38;
  Var function_local;
  IsInstInlineCache *firstInlineCache;
  
  local_38 = function;
  if (inlineCache == (IsInstInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xeea,"(inlineCache != nullptr)","inlineCache != nullptr");
    if (!bVar2) goto LAB_0071554b;
    *puVar3 = 0;
  }
  if (function == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xeeb,"(function != nullptr)","function != nullptr");
    if (!bVar2) {
LAB_0071554b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = (ThreadContext *)&this->isInstInlineCacheByFunction;
  bVar2 = JsUtil::
          BaseDictionary<void*,Js::IsInstInlineCache*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<void*>
                    ((BaseDictionary<void*,Js::IsInstInlineCache*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this_00,&local_38,(IsInstInlineCache **)&function_local);
  if (bVar2) {
    bVar2 = IsIsInstInlineCacheInList(this_00,inlineCache,(IsInstInlineCache *)function_local);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool
ThreadContext::IsIsInstInlineCacheRegistered(Js::IsInstInlineCache * inlineCache, Js::Var function)
{
    Assert(inlineCache != nullptr);
    Assert(function != nullptr);
    Js::IsInstInlineCache* firstInlineCache;
    if (this->isInstInlineCacheByFunction.TryGetValue(function, &firstInlineCache))
    {
        return IsIsInstInlineCacheInList(inlineCache, firstInlineCache);
    }
    else
    {
        return false;
    }
}